

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int btreeNext(BtCursor *pCur)

{
  MemPage *pMVar1;
  ushort uVar2;
  u32 newPgno;
  int local_2c;
  MemPage *pPage;
  int idx;
  int rc;
  BtCursor *pCur_local;
  
  if (pCur->eState != '\0') {
    if (pCur->eState < 3) {
      local_2c = 0;
    }
    else {
      local_2c = btreeRestoreCursorPosition(pCur);
    }
    if (local_2c != 0) {
      return local_2c;
    }
    if (pCur->eState == '\x01') {
      return 0x65;
    }
    if ((pCur->eState == '\x02') && (pCur->eState = '\0', 0 < pCur->skipNext)) {
      return 0;
    }
  }
  pMVar1 = pCur->pPage;
  uVar2 = pCur->ix + 1;
  pCur->ix = uVar2;
  if (pMVar1->isInit == '\0') {
    pCur_local._4_4_ = sqlite3CorruptError(0x10d51);
  }
  else if (uVar2 < pMVar1->nCell) {
    if (pMVar1->leaf == '\0') {
      pCur_local._4_4_ = moveToLeftmost(pCur);
    }
    else {
      pCur_local._4_4_ = 0;
    }
  }
  else if (pMVar1->leaf == '\0') {
    newPgno = sqlite3Get4byte(pMVar1->aData + (int)(pMVar1->hdrOffset + 8));
    pCur_local._4_4_ = moveToChild(pCur,newPgno);
    if (pCur_local._4_4_ == 0) {
      pCur_local._4_4_ = moveToLeftmost(pCur);
    }
  }
  else {
    do {
      if (pCur->iPage == '\0') {
        pCur->eState = '\x01';
        return 0x65;
      }
      moveToParent(pCur);
    } while (pCur->pPage->nCell <= pCur->ix);
    if (pCur->pPage->intKey == '\0') {
      pCur_local._4_4_ = 0;
    }
    else {
      pCur_local._4_4_ = sqlite3BtreeNext(pCur,0);
    }
  }
  return pCur_local._4_4_;
}

Assistant:

static SQLITE_NOINLINE int btreeNext(BtCursor *pCur){
  int rc;
  int idx;
  MemPage *pPage;

  assert( cursorOwnsBtShared(pCur) );
  if( pCur->eState!=CURSOR_VALID ){
    assert( (pCur->curFlags & BTCF_ValidOvfl)==0 );
    rc = restoreCursorPosition(pCur);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    if( CURSOR_INVALID==pCur->eState ){
      return SQLITE_DONE;
    }
    if( pCur->eState==CURSOR_SKIPNEXT ){
      pCur->eState = CURSOR_VALID;
      if( pCur->skipNext>0 ) return SQLITE_OK;
    }
  }

  pPage = pCur->pPage;
  idx = ++pCur->ix;
  if( !pPage->isInit ){
    /* The only known way for this to happen is for there to be a
    ** recursive SQL function that does a DELETE operation as part of a
    ** SELECT which deletes content out from under an active cursor
    ** in a corrupt database file where the table being DELETE-ed from
    ** has pages in common with the table being queried.  See TH3
    ** module cov1/btree78.test testcase 220 (2018-06-08) for an
    ** example. */
    return SQLITE_CORRUPT_BKPT;
  }

  /* If the database file is corrupt, it is possible for the value of idx 
  ** to be invalid here. This can only occur if a second cursor modifies
  ** the page while cursor pCur is holding a reference to it. Which can
  ** only happen if the database is corrupt in such a way as to link the
  ** page into more than one b-tree structure. */
  testcase( idx>pPage->nCell );

  if( idx>=pPage->nCell ){
    if( !pPage->leaf ){
      rc = moveToChild(pCur, get4byte(&pPage->aData[pPage->hdrOffset+8]));
      if( rc ) return rc;
      return moveToLeftmost(pCur);
    }
    do{
      if( pCur->iPage==0 ){
        pCur->eState = CURSOR_INVALID;
        return SQLITE_DONE;
      }
      moveToParent(pCur);
      pPage = pCur->pPage;
    }while( pCur->ix>=pPage->nCell );
    if( pPage->intKey ){
      return sqlite3BtreeNext(pCur, 0);
    }else{
      return SQLITE_OK;
    }
  }
  if( pPage->leaf ){
    return SQLITE_OK;
  }else{
    return moveToLeftmost(pCur);
  }
}